

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_compression_utils.h
# Opt level: O2

bool __thiscall draco::OctahedronToolBox::SetQuantizationBits(OctahedronToolBox *this,int32_t q)

{
  uint uVar1;
  uint uVar2;
  
  if (q - 2U < 0x1d) {
    uVar2 = -1 << ((byte)q & 0x1f);
    this->quantization_bits_ = q;
    uVar1 = -uVar2 - 2;
    this->max_quantized_value_ = ~uVar2;
    this->max_value_ = uVar1;
    this->dequantization_scale_ = 2.0 / (float)(int)uVar1;
    this->center_value_ = uVar1 >> 1;
  }
  return q - 2U < 0x1d;
}

Assistant:

bool SetQuantizationBits(int32_t q) {
    if (q < 2 || q > 30) {
      return false;
    }
    quantization_bits_ = q;
    max_quantized_value_ = (1u << quantization_bits_) - 1;
    max_value_ = max_quantized_value_ - 1;
    dequantization_scale_ = 2.f / max_value_;
    center_value_ = max_value_ / 2;
    return true;
  }